

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_173::TypeRefining::run(TypeRefining *this,Module *module)

{
  __node_base_ptr *pp_Var1;
  __node_base_ptr p_Var2;
  Global *pGVar3;
  long lVar4;
  Type TVar5;
  pointer pHVar6;
  pointer puVar7;
  pointer puVar8;
  pointer ppEVar9;
  pointer puVar10;
  DataSegment *pDVar11;
  Location location;
  Type TVar12;
  bool bVar13;
  Struct *pSVar14;
  StructValues<wasm::LUBFinder> *pSVar15;
  LUBFinder *pLVar16;
  Expression **ppEVar17;
  StructValuesMap<wasm::LUBFinder> *this_00;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar18;
  size_type sVar19;
  Struct *pSVar20;
  pointer pFVar21;
  byte bVar22;
  undefined1 auVar23 [8];
  __node_base_ptr p_Var24;
  pointer pHVar25;
  ElementSegment *pEVar26;
  int iVar27;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_4;
  ulong uVar28;
  pointer puVar29;
  pointer ppEVar30;
  uint uVar31;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar32;
  pointer puVar33;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_1;
  optional<wasm::HeapType> oVar34;
  undefined1 local_380 [8];
  Propagator propagator;
  ContentOracle oracle;
  Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  local_2d8;
  TypeRefining *local_200;
  FunctionStructValuesMap<wasm::LUBFinder> *local_1f8;
  undefined1 local_1a8 [8];
  FunctionStructValuesMap<wasm::LUBFinder> functionNewInfos;
  undefined1 auStack_120 [8];
  FunctionStructValuesMap<wasm::LUBFinder> functionSetGetInfos;
  HeapType local_d8;
  HeapType type;
  __node_base _Stack_a8;
  StructValuesMap<wasm::LUBFinder> *local_a0;
  undefined1 auStack_98 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> allTypes;
  __node_base_ptr ap_Stack_68 [2];
  Type local_58;
  Type gufaType;
  
  if (((module->features).features & 0x400) != 0) {
    if ((((this->super_Pass).runner)->options).closedWorld == false) {
      pp_Var1 = &propagator.subTypes.typeSubTypes._M_h._M_single_bucket;
      Fatal::Fatal((Fatal *)pp_Var1);
      Fatal::operator<<((Fatal *)pp_Var1,(char (*) [37])0xde9690);
      Fatal::~Fatal((Fatal *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    }
    SubTypes::SubTypes((SubTypes *)local_380,module);
    if (this->gufa == false) {
      StructUtils::FunctionStructValuesMap<wasm::LUBFinder>::FunctionStructValuesMap
                ((FunctionStructValuesMap<wasm::LUBFinder> *)local_1a8,module);
      StructUtils::FunctionStructValuesMap<wasm::LUBFinder>::FunctionStructValuesMap
                ((FunctionStructValuesMap<wasm::LUBFinder> *)auStack_120,module);
      oracle.options = (PassOptions *)&oracle.locationContents._M_h._M_bucket_count;
      oracle.wasm = (Module *)0x0;
      oracle.locationContents._M_h._M_buckets = (__buckets_ptr)0x0;
      oracle.locationContents._M_h._M_bucket_count._0_1_ = 0;
      local_2d8.replacep = (Expression **)0x0;
      local_2d8.stack.usedFixed = 0;
      local_2d8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2d8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2d8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2d8.currFunction = (Function *)0x0;
      local_2d8.currModule = (Module *)0x0;
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)&PTR__WalkerPass_011252d0;
      pp_Var1 = &propagator.subTypes.typeSubTypes._M_h._M_single_bucket;
      local_200 = (TypeRefining *)local_1a8;
      local_1f8 = (FunctionStructValuesMap<wasm::LUBFinder> *)auStack_120;
      Pass::setPassRunner((Pass *)pp_Var1,(this->super_Pass).runner);
      (*(code *)propagator.subTypes.typeSubTypes._M_h._M_single_bucket[2]._M_nxt)(pp_Var1,module);
      Pass::setPassRunner((Pass *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                          (this->super_Pass).runner);
      puVar7 = (module->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_2d8.currModule = module;
      for (puVar32 = (module->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar32 != puVar7;
          puVar32 = puVar32 + 1) {
        pGVar3 = (puVar32->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar3->super_Importable).module + 8) == (char *)0x0) {
          Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
          ::walk(&local_2d8,&pGVar3->init);
        }
      }
      puVar8 = (module->elementSegments).
               super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar29 = (module->elementSegments).
                     super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar29 != puVar8;
          puVar29 = puVar29 + 1) {
        pEVar26 = (puVar29->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (pEVar26->offset != (Expression *)0x0) {
          Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
          ::walk(&local_2d8,&pEVar26->offset);
          pEVar26 = (puVar29->_M_t).
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        }
        ppEVar9 = *(pointer *)
                   ((long)&(pEVar26->data).
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl + 8);
        for (ppEVar30 = (pEVar26->data).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start; ppEVar30 != ppEVar9;
            ppEVar30 = ppEVar30 + 1) {
          auStack_98 = (undefined1  [8])*ppEVar30;
          Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
          ::walk(&local_2d8,(Expression **)auStack_98);
        }
      }
      puVar10 = (module->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar33 = (module->dataSegments).
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar33 != puVar10;
          puVar33 = puVar33 + 1) {
        pDVar11 = (puVar33->_M_t).
                  super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                  .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar11->offset != (Expression *)0x0) {
          Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
          ::walk(&local_2d8,&pDVar11->offset);
        }
      }
      local_2d8.currModule = (Module *)0x0;
      auStack_98 = (undefined1  [8])ap_Stack_68;
      allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x1;
      allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ap_Stack_68[0] = (__node_base_ptr)0x0;
      local_d8.id = (uintptr_t)&stack0xffffffffffffff58;
      type.id = 1;
      _Stack_a8._M_nxt = (_Hash_node_base *)0x0;
      StructUtils::FunctionStructValuesMap<wasm::LUBFinder>::combineInto
                ((FunctionStructValuesMap<wasm::LUBFinder> *)local_1a8,
                 (StructValuesMap<wasm::LUBFinder> *)auStack_98);
      StructUtils::FunctionStructValuesMap<wasm::LUBFinder>::combineInto
                ((FunctionStructValuesMap<wasm::LUBFinder> *)auStack_120,
                 (StructValuesMap<wasm::LUBFinder> *)&stack0xffffffffffffff28);
      StructUtils::TypeHierarchyPropagator<wasm::LUBFinder>::propagateToSuperTypes
                ((TypeHierarchyPropagator<wasm::LUBFinder> *)local_380,
                 (StructValuesMap<wasm::LUBFinder> *)auStack_98);
      StructUtils::TypeHierarchyPropagator<wasm::LUBFinder>::propagateToSuperAndSubTypes
                ((TypeHierarchyPropagator<wasm::LUBFinder> *)local_380,
                 (StructValuesMap<wasm::LUBFinder> *)&stack0xffffffffffffff28);
      StructUtils::StructValuesMap<wasm::LUBFinder>::combineInto
                ((StructValuesMap<wasm::LUBFinder> *)auStack_98,&this->finalInfos);
      StructUtils::StructValuesMap<wasm::LUBFinder>::combineInto
                ((StructValuesMap<wasm::LUBFinder> *)&stack0xffffffffffffff28,&this->finalInfos);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&stack0xffffffffffffff28);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)auStack_98);
      WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
      ::~WalkerPass((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
                     *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      std::
      _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)auStack_120);
      std::
      _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_1a8);
    }
    else {
      ContentOracle::ContentOracle
                ((ContentOracle *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,module,
                 &((this->super_Pass).runner)->options);
      wasm::ModuleUtils::collectHeapTypes
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_98,module);
      gufaType.id = (uintptr_t)
                    allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      local_a0 = &this->finalInfos;
      for (auVar23 = auStack_98; auVar23 != (undefined1  [8])gufaType.id;
          auVar23 = (undefined1  [8])&((Expression *)auVar23)->type) {
        local_d8.id = *(uintptr_t *)auVar23;
        bVar13 = HeapType::isStruct(&stack0xffffffffffffff28);
        if (bVar13) {
          pSVar14 = HeapType::getStruct(&stack0xffffffffffffff28);
          pSVar15 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[](local_a0,local_d8);
          uVar28 = 0;
          while (iVar27 = (int)uVar28,
                uVar28 < (ulong)((long)(pSVar14->fields).
                                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pSVar14->fields).
                                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4)) {
            auStack_120 = (undefined1  [8])local_d8.id;
            functionSetGetInfos.
            super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
            ._M_h._M_before_begin._M_nxt._0_1_ = 7;
            location.
            super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            ._M_u._12_4_ = functionSetGetInfos.
                           super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                           ._M_h._M_buckets._4_4_;
            location.
            super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            ._M_u._M_first._M_storage.tupleIndex = iVar27;
            location.
            super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            ._25_7_ = functionSetGetInfos.
                      super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                      ._M_h._M_before_begin._M_nxt._1_7_;
            location.
            super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            ._M_index = 7;
            location.
            super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            ._M_u._M_first._M_storage.expr = (Expression *)local_d8.id;
            location.
            super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            ._M_u._16_8_ = functionSetGetInfos.
                           super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                           ._M_h._M_bucket_count;
            functionSetGetInfos.
            super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
            ._M_h._M_buckets._0_4_ = iVar27;
            ContentOracle::getContents
                      ((PossibleContents *)local_1a8,
                       (ContentOracle *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                       location);
            local_58 = PossibleContents::getType((PossibleContents *)local_1a8);
            std::__detail::__variant::
            _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                                 *)local_1a8);
            bVar13 = wasm::Type::isExact(&(pSVar14->fields).
                                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar28].type);
            if (!bVar13) {
              local_58 = wasm::Type::withInexactIfNoCustomDescs
                                   (&local_58,(FeatureSet)(module->features).features);
            }
            LUBFinder::LUBFinder((LUBFinder *)local_1a8,local_58);
            pLVar16 = StructUtils::StructValues<wasm::LUBFinder>::operator[](pSVar15,uVar28);
            (pLVar16->lub).id = (uintptr_t)local_1a8;
            uVar28 = (ulong)(iVar27 + 1);
          }
        }
      }
      p_Var2 = (__node_base_ptr)
               (module->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (p_Var24 = (__node_base_ptr)
                     (module->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; p_Var24 != p_Var2;
          p_Var24 = p_Var24 + 1) {
        pGVar3 = (((__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true> *)
                  &p_Var24->_M_nxt)->
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar3->super_Importable).module + 8) == (char *)0x0) {
          functionSetGetInfos.
          super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
          ._M_h._M_single_bucket = p_Var24;
          FindAll<wasm::StructNew>::FindAll((FindAll<wasm::StructNew> *)local_1a8,pGVar3->init);
          gufaType.id = (uintptr_t)
                        functionNewInfos.
                        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                        ._M_h._M_buckets;
          for (auVar23 = local_1a8; auVar23 != (undefined1  [8])gufaType.id;
              auVar23 = (undefined1  [8])((long)auVar23 + 8)) {
            lVar4 = *(long *)auVar23;
            if (*(long *)(lVar4 + 0x18) != 0) {
              local_d8 = wasm::Type::getHeapType((Type *)(lVar4 + 8));
              pSVar15 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[](local_a0,local_d8)
              ;
              pSVar14 = HeapType::getStruct(&stack0xffffffffffffff28);
              for (uVar31 = 0; uVar28 = (ulong)uVar31,
                  uVar28 < (ulong)((long)(pSVar14->fields).
                                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pSVar14->fields).
                                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4);
                  uVar31 = uVar31 + 1) {
                ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                           operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                       *)(lVar4 + 0x10),uVar28);
                TVar5.id = ((*ppEVar17)->type).id;
                pLVar16 = StructUtils::StructValues<wasm::LUBFinder>::operator[](pSVar15,uVar28);
                LUBFinder::note(pLVar16,TVar5);
              }
            }
          }
          std::_Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>::~_Vector_base
                    ((_Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_> *)
                     local_1a8);
          p_Var24 = functionSetGetInfos.
                    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                    ._M_h._M_single_bucket;
        }
      }
      StructUtils::TypeHierarchyPropagator<wasm::LUBFinder>::propagateToSuperTypes
                ((TypeHierarchyPropagator<wasm::LUBFinder> *)local_380,local_a0);
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_98);
      std::
      _Hashtable<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&oracle.options);
    }
    wasm::ModuleUtils::getPublicHeapTypes
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&stack0xffffffffffffff28,
               module);
    std::
    _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
              ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)auStack_120,local_d8.id,type.id,0,
               &propagator.subTypes.typeSubTypes._M_h._M_single_bucket,local_1a8,auStack_98);
    UniqueDeferredQueue<wasm::HeapType>::UniqueDeferredQueue
              ((UniqueDeferredQueue<wasm::HeapType> *)local_1a8);
    pp_Var1 = &propagator.subTypes.typeSubTypes._M_h._M_single_bucket;
    for (auVar23 = local_380;
        auVar23 !=
        (undefined1  [8])
        propagator.subTypes.types.
        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start; auVar23 = (undefined1  [8])((long)auVar23 + 8)) {
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)((pointer)auVar23)->id;
      bVar13 = HeapType::isStruct((HeapType *)pp_Var1);
      if ((bVar13) &&
         (oVar34 = HeapType::getDeclaredSuperType((HeapType *)pp_Var1),
         ((undefined1  [16])
          oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
         (undefined1  [16])0x0)) {
        UniqueDeferredQueue<wasm::HeapType>::push
                  ((UniqueDeferredQueue<wasm::HeapType> *)local_1a8,
                   (HeapType)propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      }
    }
    this_00 = &this->finalInfos;
    gufaType.id = gufaType.id & 0xffffffff00000000;
    while (bVar13 = UniqueDeferredQueue<wasm::HeapType>::empty
                              ((UniqueDeferredQueue<wasm::HeapType> *)local_1a8), !bVar13) {
      auStack_98 = (undefined1  [8])
                   UniqueDeferredQueue<wasm::HeapType>::pop
                             ((UniqueDeferredQueue<wasm::HeapType> *)local_1a8);
      pvVar18 = SubTypes::getImmediateSubTypes((SubTypes *)local_380,(HeapType)auStack_98);
      pHVar6 = (pvVar18->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (pHVar25 = (pvVar18->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                     _M_impl.super__Vector_impl_data._M_start; pHVar25 != pHVar6;
          pHVar25 = pHVar25 + 1) {
        UniqueDeferredQueue<wasm::HeapType>::push
                  ((UniqueDeferredQueue<wasm::HeapType> *)local_1a8,(HeapType)pHVar25->id);
      }
      sVar19 = std::
               _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)auStack_120,(key_type *)auStack_98);
      if (sVar19 == 0) {
        pSVar14 = HeapType::getStruct((HeapType *)auStack_98);
        uVar31 = 0;
        while( true ) {
          uVar28 = (ulong)uVar31;
          pFVar21 = (pSVar14->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(pSVar14->fields).
                            super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pFVar21 >> 4) <= uVar28)
          break;
          TVar5.id = pFVar21[uVar28].type.id;
          pSVar15 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                              (this_00,(HeapType)auStack_98);
          pLVar16 = StructUtils::StructValues<wasm::LUBFinder>::operator[](pSVar15,uVar28);
          if ((pLVar16->lub).id == 1) {
            LUBFinder::LUBFinder
                      ((LUBFinder *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,TVar5);
            (pLVar16->lub).id = (uintptr_t)propagator.subTypes.typeSubTypes._M_h._M_single_bucket;
          }
          uVar31 = uVar31 + 1;
        }
        oVar34 = HeapType::getDeclaredSuperType((HeapType *)auStack_98);
        propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
             oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
        oracle.wasm = (Module *)
                      CONCAT71(oracle.wasm._1_7_,
                               oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._M_engaged);
        if (((undefined1  [16])
             oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          pSVar20 = HeapType::getStruct((HeapType *)
                                        &propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
          for (uVar31 = 0; uVar28 = (ulong)uVar31,
              uVar28 < (ulong)((long)(pSVar20->fields).
                                     super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(pSVar20->fields).
                                     super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 4);
              uVar31 = uVar31 + 1) {
            sVar19 = std::
                     _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)auStack_120,
                             (key_type *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
            if (sVar19 == 0) {
              pSVar15 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                                  (this_00,(HeapType)
                                           propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
              pFVar21 = (pointer)StructUtils::StructValues<wasm::LUBFinder>::operator[]
                                           (pSVar15,uVar28);
            }
            else {
              pFVar21 = (pSVar20->fields).
                        super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar28;
            }
            TVar5.id = (pFVar21->type).id;
            pSVar15 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                                (this_00,(HeapType)auStack_98);
            pLVar16 = StructUtils::StructValues<wasm::LUBFinder>::operator[](pSVar15,uVar28);
            bVar13 = wasm::Type::isSubType((Type)(pLVar16->lub).id,TVar5);
            if (bVar13) {
              if ((pSVar14->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar28].mutable_ == Mutable) {
                LUBFinder::LUBFinder((LUBFinder *)&local_58,TVar5);
                goto LAB_00b871d1;
              }
            }
            else {
              LUBFinder::LUBFinder((LUBFinder *)&local_58,TVar5);
LAB_00b871d1:
              (pLVar16->lub).id = local_58.id;
            }
          }
        }
        uVar31 = 0;
        while( true ) {
          uVar28 = (ulong)uVar31;
          pFVar21 = (pSVar14->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(pSVar14->fields).
                            super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pFVar21 >> 4) <= uVar28)
          break;
          TVar5.id = pFVar21[uVar28].type.id;
          pSVar15 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                              (this_00,(HeapType)auStack_98);
          pLVar16 = StructUtils::StructValues<wasm::LUBFinder>::operator[](pSVar15,uVar28);
          TVar12 = gufaType;
          bVar22 = (byte)gufaType.id;
          gufaType.id._1_3_ = (int3)(gufaType.id >> 8);
          gufaType.id._0_1_ = bVar22 | (pLVar16->lub).id != TVar5.id;
          gufaType.id._4_4_ = SUB84(TVar12.id,4);
          uVar31 = uVar31 + 1;
        }
      }
    }
    if ((gufaType.id & 1) != 0) {
      oracle.options = (PassOptions *)&oracle.locationContents._M_h._M_bucket_count;
      oracle.wasm = (Module *)0x0;
      oracle.locationContents._M_h._M_buckets = (__buckets_ptr)0x0;
      oracle.locationContents._M_h._M_bucket_count._0_1_ = 0;
      local_2d8.replacep = (Expression **)0x0;
      local_2d8.stack.usedFixed = 0;
      local_2d8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2d8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2d8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2d8.currFunction = (Function *)0x0;
      local_2d8.currModule = (Module *)0x0;
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)&PTR__WalkerPass_01125330;
      pp_Var1 = &propagator.subTypes.typeSubTypes._M_h._M_single_bucket;
      local_200 = this;
      Pass::setPassRunner((Pass *)pp_Var1,(this->super_Pass).runner);
      (*(code *)propagator.subTypes.typeSubTypes._M_h._M_single_bucket[2]._M_nxt)(pp_Var1,module);
      Pass::setPassRunner((Pass *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                          (this->super_Pass).runner);
      puVar7 = (module->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_2d8.currModule = module;
      for (puVar32 = (module->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar32 != puVar7;
          puVar32 = puVar32 + 1) {
        pGVar3 = (puVar32->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar3->super_Importable).module + 8) == (char *)0x0) {
          Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>::walk
                    ((Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_> *)&local_2d8,
                     &pGVar3->init);
        }
      }
      puVar8 = (module->elementSegments).
               super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar29 = (module->elementSegments).
                     super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar29 != puVar8;
          puVar29 = puVar29 + 1) {
        pEVar26 = (puVar29->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (pEVar26->offset != (Expression *)0x0) {
          Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>::walk
                    ((Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_> *)&local_2d8,
                     &pEVar26->offset);
          pEVar26 = (puVar29->_M_t).
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        }
        ppEVar9 = *(pointer *)
                   ((long)&(pEVar26->data).
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl + 8);
        for (ppEVar30 = (pEVar26->data).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start; ppEVar30 != ppEVar9;
            ppEVar30 = ppEVar30 + 1) {
          auStack_98 = (undefined1  [8])*ppEVar30;
          Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>::walk
                    ((Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_> *)&local_2d8,
                     (Expression **)auStack_98);
        }
      }
      puVar10 = (module->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar33 = (module->dataSegments).
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar33 != puVar10;
          puVar33 = puVar33 + 1) {
        pDVar11 = (puVar33->_M_t).
                  super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                  .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar11->offset != (Expression *)0x0) {
          Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>::walk
                    ((Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_> *)&local_2d8,
                     &pDVar11->offset);
        }
      }
      local_2d8.currModule = (Module *)0x0;
      WalkerPass<wasm::PostWalker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>_>::~WalkerPass
                ((WalkerPass<wasm::PostWalker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>_> *)
                 &propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      GlobalTypeRewriter::GlobalTypeRewriter
                ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                 module);
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)&PTR__GlobalTypeRewriter_01125390;
      auStack_98 = (undefined1  [8])0x0;
      allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2d8.stack.fixed._M_elems[0].func = (TaskFunc)this;
      GlobalTypeRewriter::update
                ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                 (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_98);
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_98);
      GlobalTypeRewriter::~GlobalTypeRewriter
                ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      ReFinalize::ReFinalize((ReFinalize *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      ::run((WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
             *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,(this->super_Pass).runner,
            module);
      pp_Var1 = &propagator.subTypes.typeSubTypes._M_h._M_single_bucket;
      ReFinalize::~ReFinalize((ReFinalize *)pp_Var1);
      oracle.wasm = (Module *)0x0;
      oracle.options = (PassOptions *)&oracle.locationContents._M_h._M_bucket_count;
      oracle.locationContents._M_h._M_buckets = (__buckets_ptr)0x0;
      oracle.locationContents._M_h._M_bucket_count._0_1_ = 0;
      local_2d8.replacep = (Expression **)0x0;
      local_2d8.stack.usedFixed = 0;
      local_2d8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2d8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2d8.currModule = (Module *)0x0;
      local_2d8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2d8.currFunction = (Function *)0x0;
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)&PTR__WalkerPass_011253e0;
      Pass::setPassRunner((Pass *)pp_Var1,(this->super_Pass).runner);
      (*(code *)propagator.subTypes.typeSubTypes._M_h._M_single_bucket[2]._M_nxt)(pp_Var1,module);
      Pass::setPassRunner((Pass *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                          (this->super_Pass).runner);
      puVar7 = (module->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_2d8.currModule = module;
      for (puVar32 = (module->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar32 != puVar7;
          puVar32 = puVar32 + 1) {
        pGVar3 = (puVar32->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar3->super_Importable).module + 8) == (char *)0x0) {
          Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::walk
                    ((Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_> *)&local_2d8,
                     &pGVar3->init);
        }
      }
      puVar8 = (module->elementSegments).
               super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar29 = (module->elementSegments).
                     super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar29 != puVar8;
          puVar29 = puVar29 + 1) {
        pEVar26 = (puVar29->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (pEVar26->offset != (Expression *)0x0) {
          Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::walk
                    ((Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_> *)&local_2d8,
                     &pEVar26->offset);
          pEVar26 = (puVar29->_M_t).
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        }
        ppEVar9 = *(pointer *)
                   ((long)&(pEVar26->data).
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl + 8);
        for (ppEVar30 = (pEVar26->data).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start; ppEVar30 != ppEVar9;
            ppEVar30 = ppEVar30 + 1) {
          auStack_98 = (undefined1  [8])*ppEVar30;
          Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::walk
                    ((Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_> *)&local_2d8,
                     (Expression **)auStack_98);
        }
      }
      puVar10 = (module->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar33 = (module->dataSegments).
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar33 != puVar10;
          puVar33 = puVar33 + 1) {
        pDVar11 = (puVar33->_M_t).
                  super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                  .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar11->offset != (Expression *)0x0) {
          Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::walk
                    ((Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_> *)&local_2d8,
                     &pDVar11->offset);
        }
      }
      local_2d8.currModule = (Module *)0x0;
      WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>::~WalkerPass
                ((WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_> *)
                 &propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    }
    UniqueDeferredQueue<wasm::HeapType>::~UniqueDeferredQueue
              ((UniqueDeferredQueue<wasm::HeapType> *)local_1a8);
    std::
    _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)auStack_120);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &stack0xffffffffffffff28);
    SubTypes::~SubTypes((SubTypes *)local_380);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "TypeRefining requires --closed-world";
    }

    Propagator propagator(*module);

    // Compute our main data structure, finalInfos, either normally or using
    // GUFA.
    if (!gufa) {
      computeFinalInfos(module, propagator);
    } else {
      computeFinalInfosGUFA(module, propagator);
    }

    useFinalInfos(module, propagator);
  }